

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

int docall(lua_State *L,int narg,int nres)

{
  int iVar1;
  int iVar2;
  
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 - narg;
  lua_pushcclosure(L,msghandler,0);
  lua_rotate(L,iVar1,1);
  globalL = L;
  __sysv_signal(2,laction);
  iVar2 = lua_pcallk(L,narg,nres,iVar1,0,(lua_KFunction)0x0);
  __sysv_signal(2,(__sighandler_t)0x0);
  lua_rotate(L,iVar1,-1);
  lua_settop(L,-2);
  return iVar2;
}

Assistant:

static int docall (lua_State *L, int narg, int nres) {
  int status;
  int base = lua_gettop(L) - narg;  /* function index */
  lua_pushcfunction(L, msghandler);  /* push message handler */
  lua_insert(L, base);  /* put it under function and args */
  globalL = L;  /* to be available to 'laction' */
  signal(SIGINT, laction);  /* set C-signal handler */
  status = lua_pcall(L, narg, nres, base);
  signal(SIGINT, SIG_DFL); /* reset C-signal handler */
  lua_remove(L, base);  /* remove message handler from the stack */
  return status;
}